

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_skewed_uint16_cardinality
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int32_t iVar1;
  int iVar2;
  long in_RCX;
  uint16_t *in_RDX;
  long in_RSI;
  ushort *in_RDI;
  uint16_t val_s;
  uint16_t val_l;
  size_t idx_s;
  size_t idx_l;
  size_t pos;
  ushort local_44;
  ushort local_42;
  long local_40;
  long local_38;
  
  iVar2 = 0;
  local_38 = 0;
  local_40 = 0;
  if (in_RSI == 0) {
    return 0;
  }
  local_42 = *in_RDX;
  local_44 = *in_RDI;
  do {
    while( true ) {
      if (local_44 <= local_42) break;
      iVar1 = advanceUntil(in_RDX,(int32_t)local_38,(int32_t)in_RCX,local_44);
      local_38 = (long)iVar1;
      if (local_38 == in_RCX) {
        return iVar2;
      }
      local_42 = in_RDX[local_38];
    }
    if (local_44 < local_42) {
      if (local_40 + 1 == in_RSI) {
        return iVar2;
      }
      local_44 = in_RDI[local_40 + 1];
    }
    else {
      iVar2 = iVar2 + 1;
      if (local_40 + 1 == in_RSI) {
        return iVar2;
      }
      local_44 = in_RDI[local_40 + 1];
      iVar1 = advanceUntil(in_RDX,(int32_t)local_38,(int32_t)in_RCX,local_44);
      local_38 = (long)iVar1;
      if (local_38 == in_RCX) {
        return iVar2;
      }
      local_42 = in_RDX[local_38];
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int32_t intersect_skewed_uint16_cardinality(const uint16_t *small,
                                            size_t size_s,
                                            const uint16_t *large,
                                            size_t size_l) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            pos++;
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        }
    }

    return (int32_t)pos;
}